

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cf-socket.c
# Opt level: O3

CURLcode cf_socket_query(Curl_cfilter *cf,Curl_easy *data,int query,int *pres1,void *pres2)

{
  uint *puVar1;
  Curl_cfilter *pCVar2;
  CURLcode CVar3;
  timediff_t tVar4;
  timediff_t tVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  curltime newer;
  curltime older;
  
  puVar1 = (uint *)cf->ctx;
  if (query == 2) {
    tVar5 = 0xffffffff;
    if ((puVar1[0x5f] & 1) != 0) {
      newer._12_4_ = 0;
      newer._0_12_ = *(undefined1 (*) [12])(puVar1 + 0x5a);
      older._12_4_ = 0;
      older._0_12_ = *(undefined1 (*) [12])(puVar1 + 0x52);
      tVar4 = Curl_timediff(newer,older);
      tVar5 = 0x7fffffff;
      if (tVar4 < 0x7fffffff) {
        tVar5 = tVar4;
      }
    }
    *pres1 = (int)tVar5;
  }
  else if (query == 4) {
    if (((*puVar1 & 0xfffffffe) == 4) && ((puVar1[0x5f] & 1) != 0)) {
      uVar6 = puVar1[0x5a];
      uVar7 = puVar1[0x5b];
      uVar8 = puVar1[0x5c];
      uVar9 = puVar1[0x5d];
    }
    else {
      uVar6 = puVar1[0x56];
      uVar7 = puVar1[0x57];
      uVar8 = puVar1[0x58];
      uVar9 = puVar1[0x59];
    }
    *(uint *)pres2 = uVar6;
    *(uint *)((long)pres2 + 4) = uVar7;
    *(uint *)((long)pres2 + 8) = uVar8;
    *(uint *)((long)pres2 + 0xc) = uVar9;
  }
  else {
    if (query != 3) {
      pCVar2 = cf->next;
      if (pCVar2 == (Curl_cfilter *)0x0) {
        return CURLE_UNKNOWN_OPTION;
      }
      CVar3 = (*pCVar2->cft->query)(pCVar2,data,query,pres1,pres2);
      return CVar3;
    }
    *(uint *)pres2 = puVar1[0x26];
  }
  return CURLE_OK;
}

Assistant:

static CURLcode cf_socket_query(struct Curl_cfilter *cf,
                                struct Curl_easy *data,
                                int query, int *pres1, void *pres2)
{
  struct cf_socket_ctx *ctx = cf->ctx;

  switch(query) {
  case CF_QUERY_SOCKET:
    DEBUGASSERT(pres2);
    *((curl_socket_t *)pres2) = ctx->sock;
    return CURLE_OK;
  case CF_QUERY_CONNECT_REPLY_MS:
    if(ctx->got_first_byte) {
      timediff_t ms = Curl_timediff(ctx->first_byte_at, ctx->started_at);
      *pres1 = (ms < INT_MAX)? (int)ms : INT_MAX;
    }
    else
      *pres1 = -1;
    return CURLE_OK;
  case CF_QUERY_TIMER_CONNECT: {
    struct curltime *when = pres2;
    switch(ctx->transport) {
    case TRNSPRT_UDP:
    case TRNSPRT_QUIC:
      /* Since UDP connected sockets work different from TCP, we use the
       * time of the first byte from the peer as the "connect" time. */
      if(ctx->got_first_byte) {
        *when = ctx->first_byte_at;
        break;
      }
      FALLTHROUGH();
    default:
      *when = ctx->connected_at;
      break;
    }
    return CURLE_OK;
  }
  default:
    break;
  }
  return cf->next?
    cf->next->cft->query(cf->next, data, query, pres1, pres2) :
    CURLE_UNKNOWN_OPTION;
}